

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

MemberAccessExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MemberAccessExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,Token *args_2)

{
  Token dot;
  Token name;
  MemberAccessExpressionSyntax *this_00;
  
  this_00 = (MemberAccessExpressionSyntax *)allocate(this,0x38,8);
  dot.kind = args_1->kind;
  dot._2_1_ = args_1->field_0x2;
  dot.numFlags.raw = (args_1->numFlags).raw;
  dot.rawLen = args_1->rawLen;
  dot.info = args_1->info;
  name.kind = args_2->kind;
  name._2_1_ = args_2->field_0x2;
  name.numFlags.raw = (args_2->numFlags).raw;
  name.rawLen = args_2->rawLen;
  name.info = args_2->info;
  slang::syntax::MemberAccessExpressionSyntax::MemberAccessExpressionSyntax(this_00,args,dot,name);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }